

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O1

void anon_unknown.dwarf_110eda::trimString(string *str)

{
  ulong uVar1;
  undefined8 uVar2;
  string spaceChars;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38," \f\n\r\t\v","");
  std::__cxx11::string::find_first_not_of((char *)str,(ulong)local_38[0],0);
  std::__cxx11::string::erase((ulong)str,0);
  uVar1 = std::__cxx11::string::find_last_not_of((char *)str,(ulong)local_38[0],0xffffffffffffffff);
  if (uVar1 != 0xffffffffffffffff) {
    if (str->_M_string_length <= uVar1) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      _Unwind_Resume(uVar2);
    }
    str->_M_string_length = uVar1 + 1;
    (str->_M_dataplus)._M_p[uVar1 + 1] = '\0';
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void trimString(string& str)
{
  string spaceChars = " \f\n\r\t\v";
  size_t pos = str.find_first_not_of(spaceChars);
  str.erase(0, pos);

  pos = str.find_last_not_of(spaceChars);
  if (pos != string::npos)
    str.erase(pos + 1);
}